

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void CVmBifTADS::re_group(uint argc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  char *pcVar5;
  byte *pbVar6;
  long lVar7;
  byte *str;
  re_group_register_conflict *prVar8;
  char buf [17];
  char local_58 [7];
  char local_51 [5];
  char local_4c [20];
  vm_val_t local_38;
  
  CVmBif::check_argc(argc,1);
  iVar3 = CVmBif::pop_int_val();
  if (iVar3 == 0) {
    prVar8 = &G_bif_tads_globals_X->rex_searcher->match_;
  }
  else {
    if (iVar3 - 0xbU < 0xfffffff6) {
      err_throw(0x902);
    }
    if (G_bif_tads_globals_X->rex_searcher->group_cnt_ < iVar3) goto LAB_0025925a;
    prVar8 = (re_group_register_conflict *)
             (&(G_bif_tads_globals_X->rex_searcher->super_CRegexSearcher).field_0x24 +
             (ulong)(iVar3 - 1) * 8);
  }
  pcVar5 = vm_val_t::get_as_string(&G_bif_tads_globals_X->last_rex_str->val);
  if (pcVar5 != (char *)0x0) {
    iVar3 = prVar8->start_ofs;
    if (((long)iVar3 != -1) && (prVar8->end_ofs != -1)) {
      local_58[0] = '\x03';
      local_58[1] = '\0';
      str = (byte *)(pcVar5 + (long)iVar3 + 2);
      if (iVar3 < 1) {
        local_38.val.obj = 1;
      }
      else {
        pbVar6 = (byte *)(pcVar5 + 2);
        local_38.val.obj = 1;
        do {
          pbVar6 = pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 & (uint)(*pbVar6 >> 7) * 3) + 1;
          local_38.val.obj = local_38.val.obj + 1;
        } while (pbVar6 < str);
      }
      local_38.typ = VM_INT;
      vmb_put_dh(local_58 + 2,&local_38);
      lVar7 = (long)prVar8->end_ofs - (long)prVar8->start_ofs;
      if ((int)lVar7 < 1) {
        local_38.val.obj = 0;
      }
      else {
        local_38.val.obj = 0;
        pbVar6 = str;
        do {
          pbVar6 = pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 & (uint)(*pbVar6 >> 7) * 3) + 1;
          local_38.val.obj = local_38.val.obj + 1;
        } while (pbVar6 < str + lVar7);
      }
      local_38.typ = VM_INT;
      vmb_put_dh(local_51,&local_38);
      vVar4 = CVmObjString::create(0,(char *)str,(long)prVar8->end_ofs - (long)prVar8->start_ofs);
      local_38.typ = VM_OBJ;
      local_38.val.obj = vVar4;
      vmb_put_dh(local_4c,&local_38);
      pvVar2 = sp_;
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_OBJ;
      (pvVar2->val).obj = vVar4;
      vVar4 = CVmObjList::create(0,local_58);
      CVmBif::retval_obj(vVar4);
      sp_ = sp_ + -1;
      return;
    }
  }
LAB_0025925a:
  CVmBif::retval_nil();
  return;
}

Assistant:

void CVmBifTADS::re_group(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the group number to retrieve */
    int groupno = pop_int_val(vmg0_);

    /* group 0 is the special group for the overall match */
    const re_group_register *reg;
    if (groupno == 0)
    {
        /* get the special register for the overall match */
        reg = G_bif_tads_globals->rex_searcher->get_last_match();
    }
    else
    {
        /* make sure it's in range */
        if (groupno < 1 || groupno > RE_GROUP_REG_CNT)
            err_throw(VMERR_BAD_VAL_BIF);
        
        /* adjust from a 1-base to a 0-base */
        --groupno;
        
        /* if the group doesn't exist in the pattern, return nil */
        if (groupno >= G_bif_tads_globals->rex_searcher->get_group_cnt())
        {
            retval_nil(vmg0_);
            return;
        }

        /* get the group register */
        reg = G_bif_tads_globals->rex_searcher->get_group_reg(groupno);
    }